

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionElimination.cc
# Opt level: O1

bool flow::transform::rewriteBrToExit(IRHandler *handler)

{
  BasicBlock *this;
  BasicBlock *otherBB;
  bool bVar1;
  TerminateInstr *pTVar2;
  long lVar3;
  long *plVar4;
  _List_node_base *p_Var5;
  byte unaff_R14B;
  _Head_base<0UL,_flow::Instr_*,_false> local_40;
  _func_int **local_38;
  
  p_Var5 = (_List_node_base *)&handler->blocks_;
  do {
    p_Var5 = (((_List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var5 == (_List_node_base *)&handler->blocks_) {
      unaff_R14B = 0;
      break;
    }
    this = (BasicBlock *)p_Var5[1]._M_next;
    pTVar2 = BasicBlock::getTerminator(this);
    if (pTVar2 == (TerminateInstr *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar3 = __dynamic_cast(pTVar2,&TerminateInstr::typeinfo,&BrInstr::typeinfo,0);
    }
    if (lVar3 == 0) {
      bVar1 = true;
    }
    else {
      otherBB = (BasicBlock *)**(undefined8 **)(lVar3 + 0x50);
      if (((long)(otherBB->code_).
                 super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(otherBB->code_).
                 super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start != 8) ||
         (bVar1 = BasicBlock::isAfter(this,otherBB), bVar1)) {
        bVar1 = false;
        unaff_R14B = 0;
      }
      else {
        pTVar2 = BasicBlock::getTerminator(otherBB);
        if (pTVar2 == (TerminateInstr *)0x0) {
          plVar4 = (long *)0x0;
        }
        else {
          plVar4 = (long *)__dynamic_cast(pTVar2,&TerminateInstr::typeinfo,&RetInstr::typeinfo,0);
        }
        bVar1 = plVar4 == (long *)0x0;
        if (!bVar1) {
          BasicBlock::remove((BasicBlock *)&stack0xffffffffffffffc8,(char *)this);
          if (local_38 != (_func_int **)0x0) {
            (**(code **)(*local_38 + 8))();
          }
          local_38 = (_func_int **)0x0;
          (**(code **)(*plVar4 + 0x18))(&local_40,plVar4);
          BasicBlock::push_back
                    (this,(unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)&local_40);
          if (local_40._M_head_impl != (Instr *)0x0) {
            (*((local_40._M_head_impl)->super_Value)._vptr_Value[1])();
          }
          local_40._M_head_impl = (Instr *)0x0;
          unaff_R14B = 1;
          bVar1 = false;
        }
      }
    }
  } while (bVar1);
  return (bool)(unaff_R14B & 1);
}

Assistant:

bool rewriteBrToExit(IRHandler* handler) {
  for (BasicBlock* bb : handler->basicBlocks()) {
    if (BrInstr* br = dynamic_cast<BrInstr*>(bb->getTerminator())) {
      BasicBlock* targetBB = br->targetBlock();

      if (targetBB->size() != 1)
        return false;

      if (bb->isAfter(targetBB))
        return false;

      if (RetInstr* ret = dynamic_cast<RetInstr*>(targetBB->getTerminator())) {
        bb->remove(br);
        bb->push_back(ret->clone());

        // FLOW_TRACE("flow: eliminate branch-to-exit block");
        return true;
      }
    }
  }

  return false;
}